

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

int share_xchannel_server_cmp(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(uint *)((long)bv + 4) <= *(uint *)((long)av + 4)) {
    uVar1 = (uint)(*(uint *)((long)bv + 4) < *(uint *)((long)av + 4));
  }
  return uVar1;
}

Assistant:

static int share_xchannel_server_cmp(void *av, void *bv)
{
    const struct share_xchannel *a = (const struct share_xchannel *)av;
    const struct share_xchannel *b = (const struct share_xchannel *)bv;

    if (a->server_id < b->server_id)
        return -1;
    else if (a->server_id > b->server_id)
        return +1;
    else
        return 0;
}